

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIff.c
# Opt level: O3

float Gia_IffObjTimeOne(Iff_Man_t *p,int iObj,int iFaninSkip2,int iFaninSkip3)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  
  if (-1 < iObj) {
    pVVar6 = p->pGia->vMapping;
    uVar2 = pVVar6->nSize;
    if (iObj < (int)uVar2) {
      piVar7 = pVVar6->pArray;
      uVar3 = piVar7[(uint)iObj];
      if ((-1 < (int)uVar3) && (uVar3 < uVar2)) {
        uVar4 = piVar7[uVar3];
        uVar8 = 0;
        if (0 < (int)uVar4) {
          uVar8 = (ulong)uVar4;
        }
        fVar10 = -1e+09;
        if (0 < (int)uVar4) {
          uVar9 = 0;
          do {
            uVar5 = (piVar7 + uVar3)[uVar9 + 1];
            if (uVar5 != iFaninSkip3 && uVar5 != iFaninSkip2) {
              if (((int)uVar5 < 0) || (p->vTimes->nSize <= (int)uVar5)) goto LAB_006fa060;
              fVar1 = p->vTimes->pArray[uVar5];
              if (fVar10 < fVar1) {
                fVar10 = fVar1;
              }
            }
            uVar9 = uVar9 + 1;
          } while (uVar8 != uVar9);
        }
        if ((int)uVar4 < 0) {
          __assert_fail("i == Gia_ObjLutSize(p->pGia, iObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIff.c"
                        ,0x97,"float Gia_IffObjTimeOne(Iff_Man_t *, int, int, int)");
        }
        if (iFaninSkip2 == -1) {
          return fVar10;
        }
        if ((-1 < iFaninSkip2) && ((uint)iFaninSkip2 < uVar2)) {
          uVar3 = piVar7[(uint)iFaninSkip2];
          if ((-1 < (int)uVar3) && (uVar3 < uVar2)) {
            uVar4 = piVar7[uVar3];
            if (0 < (int)uVar4) {
              uVar8 = 0;
              do {
                uVar5 = (piVar7 + uVar3)[uVar8 + 1];
                if (uVar5 != iFaninSkip3) {
                  if (((int)uVar5 < 0) || (p->vTimes->nSize <= (int)uVar5)) goto LAB_006fa060;
                  fVar1 = p->vTimes->pArray[uVar5];
                  if (fVar10 < fVar1) {
                    fVar10 = fVar1;
                  }
                }
                uVar8 = uVar8 + 1;
              } while (uVar4 != uVar8);
            }
            if (iFaninSkip3 == -1) {
              return fVar10;
            }
            if ((-1 < iFaninSkip3) && ((uint)iFaninSkip3 < uVar2)) {
              uVar3 = piVar7[(uint)iFaninSkip3];
              if ((-1 < (int)uVar3) && (uVar3 < uVar2)) {
                uVar2 = piVar7[uVar3];
                if (0 < (int)uVar2) {
                  uVar8 = 0;
                  do {
                    uVar4 = (piVar7 + uVar3)[uVar8 + 1];
                    if (uVar4 != iFaninSkip2) {
                      if (((int)uVar4 < 0) || (p->vTimes->nSize <= (int)uVar4)) {
LAB_006fa060:
                        __assert_fail("i >= 0 && i < p->nSize",
                                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
                                      ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
                      }
                      fVar1 = p->vTimes->pArray[uVar4];
                      if (fVar10 < fVar1) {
                        fVar10 = fVar1;
                      }
                    }
                    uVar8 = uVar8 + 1;
                  } while (uVar2 != uVar8);
                }
                if (0.0 <= fVar10) {
                  return fVar10;
                }
                __assert_fail("DelayMax >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIff.c"
                              ,0xa2,"float Gia_IffObjTimeOne(Iff_Man_t *, int, int, int)");
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

float Gia_IffObjTimeOne( Iff_Man_t * p, int iObj, int iFaninSkip2, int iFaninSkip3 )
{
    int i, iFanin;
    float DelayMax = -ABC_INFINITY;
    Gia_LutForEachFanin( p->pGia, iObj, iFanin, i )
        if ( iFanin != iFaninSkip2 && iFanin != iFaninSkip3 && DelayMax < Iff_ObjTimeId(p, iFanin) )
            DelayMax = Iff_ObjTimeId(p, iFanin);
    assert( i == Gia_ObjLutSize(p->pGia, iObj) );
    if ( iFaninSkip2 == -1 )
        return DelayMax;
    Gia_LutForEachFanin( p->pGia, iFaninSkip2, iFanin, i )
        if ( iFanin != iFaninSkip3 && DelayMax < Iff_ObjTimeId(p, iFanin) )
            DelayMax = Iff_ObjTimeId(p, iFanin);
    if ( iFaninSkip3 == -1 )
        return DelayMax;
    Gia_LutForEachFanin( p->pGia, iFaninSkip3, iFanin, i )
        if ( iFanin != iFaninSkip2 && DelayMax < Iff_ObjTimeId(p, iFanin) )
            DelayMax = Iff_ObjTimeId(p, iFanin);
    assert( DelayMax >= 0 );
    return DelayMax;
}